

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

NestedCompositeComponents * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateScalarInterfaceVarsForArray
          (NestedCompositeComponents *__return_storage_ptr__,
          InterfaceVariableScalarReplacement *this,Instruction *interface_var_type,
          StorageClass storage_class,uint32_t extra_array_length)

{
  uint32_t uVar1;
  DefUseManager *def_use_mgr;
  Instruction *interface_var_type_00;
  bool bVar2;
  NestedCompositeComponents scalar_vars_for_element;
  NestedCompositeComponents local_50;
  
  if (interface_var_type->opcode_ == OpTypeArray) {
    def_use_mgr = IRContext::get_def_use_mgr((this->super_Pass).context_);
    uVar1 = anon_unknown_0::GetArrayLength(def_use_mgr,interface_var_type);
    interface_var_type_00 = anon_unknown_0::GetArrayElementType(def_use_mgr,interface_var_type);
    (__return_storage_ptr__->nested_composite_components).
    super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->nested_composite_components).
    super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->nested_composite_components).
    super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->component_variable = (Instruction *)0x0;
    while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
      CreateScalarInterfaceVarsForReplacement
                (&local_50,this,interface_var_type_00,storage_class,extra_array_length);
      std::
      vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
      ::push_back(&__return_storage_ptr__->nested_composite_components,&local_50);
      std::
      vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
      ::~vector(&local_50.nested_composite_components);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("interface_var_type->opcode() == spv::Op::OpTypeArray",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                ,0x322,
                "InterfaceVariableScalarReplacement::NestedCompositeComponents spvtools::opt::InterfaceVariableScalarReplacement::CreateScalarInterfaceVarsForArray(Instruction *, spv::StorageClass, uint32_t)"
               );
}

Assistant:

InterfaceVariableScalarReplacement::NestedCompositeComponents
InterfaceVariableScalarReplacement::CreateScalarInterfaceVarsForArray(
    Instruction* interface_var_type, spv::StorageClass storage_class,
    uint32_t extra_array_length) {
  assert(interface_var_type->opcode() == spv::Op::OpTypeArray);

  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t array_length = GetArrayLength(def_use_mgr, interface_var_type);
  Instruction* elem_type = GetArrayElementType(def_use_mgr, interface_var_type);

  NestedCompositeComponents scalar_vars;
  while (array_length > 0) {
    NestedCompositeComponents scalar_vars_for_element =
        CreateScalarInterfaceVarsForReplacement(elem_type, storage_class,
                                                extra_array_length);
    scalar_vars.AddComponent(scalar_vars_for_element);
    --array_length;
  }
  return scalar_vars;
}